

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidyWarnMissingSIInEmittedDocType(TidyDocImpl *doc)

{
  ctmbstr ptVar1;
  Node *node;
  AttVal *pAVar2;
  Node *doctype;
  Bool isXhtml;
  TidyDocImpl *doc_local;
  
  if ((((doc->lexer->isvoyager == no) &&
       (ptVar1 = prvTidyHTMLVersionNameFromCode(doc->lexer->versionEmitted,no),
       ptVar1 != (ctmbstr)0x0)) &&
      (ptVar1 = GetSIFromVers(doc->lexer->versionEmitted), ptVar1 != (ctmbstr)0x0)) &&
     ((node = prvTidyFindDocType(doc), node != (Node *)0x0 &&
      (pAVar2 = prvTidyGetAttrByName(node,"SYSTEM"), pAVar2 == (AttVal *)0x0)))) {
    return yes;
  }
  return no;
}

Assistant:

Bool TY_(WarnMissingSIInEmittedDocType)( TidyDocImpl* doc )
{
    Bool isXhtml = doc->lexer->isvoyager;
    Node* doctype;
    
    /* Do not warn in XHTML mode */
    if ( isXhtml )
        return no;

    /* Do not warn if emitted doctype is proprietary */
    if ( TY_(HTMLVersionNameFromCode)(doc->lexer->versionEmitted, isXhtml ) == NULL )
        return no;

    /* Do not warn if no SI is possible */
    if ( GetSIFromVers(doc->lexer->versionEmitted) == NULL )
        return no;

    if ( (doctype = TY_(FindDocType)( doc )) != NULL
         && TY_(GetAttrByName)(doctype, "SYSTEM") == NULL )
        return yes;

    return no;
}